

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.hpp
# Opt level: O1

String * __thiscall
Diligent::GetShaderResourcePrintName_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,char *Name,Uint32 ArraySize,
          Uint32 ArrayIndex)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  Uint32 UVar4;
  string msg;
  string local_48;
  
  if ((uint)Name <= ArraySize) {
    FormatString<char[28]>(&local_48,(char (*) [28])"Array index is out of range");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"GetShaderResourcePrintName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/GraphicsAccessories.hpp"
               ,0x323);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,(allocator *)&local_48)
  ;
  if (1 < (uint)Name) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    cVar3 = '\x01';
    if (9 < ArraySize) {
      UVar4 = ArraySize;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (UVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_0020f28e;
        }
        if (UVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_0020f28e;
        }
        if (UVar4 < 10000) goto LAB_0020f28e;
        bVar1 = 99999 < UVar4;
        UVar4 = UVar4 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_0020f28e:
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,ArraySize);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String GetShaderResourcePrintName(const char* Name, Uint32 ArraySize, Uint32 ArrayIndex)
{
    VERIFY(ArrayIndex < ArraySize, "Array index is out of range");
    String PrintName = Name;
    if (ArraySize > 1)
    {
        PrintName.push_back('[');
        PrintName.append(std::to_string(ArrayIndex));
        PrintName.push_back(']');
    }
    return PrintName;
}